

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_write_mDCV_fixed
               (png_structrp png_ptr,png_uint_16 red_x,png_uint_16 red_y,png_uint_16 green_x,
               png_uint_16 green_y,png_uint_16 blue_x,png_uint_16 blue_y,png_uint_16 white_x,
               png_uint_16 white_y,png_uint_32 maxDL,png_uint_32 minDL)

{
  png_byte local_38 [2];
  png_byte apStack_36 [2];
  png_byte apStack_34 [2];
  png_byte apStack_32 [2];
  png_byte buf [24];
  png_uint_16 blue_x_local;
  png_uint_16 green_y_local;
  png_uint_16 green_x_local;
  png_uint_16 red_y_local;
  png_uint_16 red_x_local;
  png_structrp png_ptr_local;
  
  buf._22_2_ = blue_x;
  png_save_uint_16(local_38,(uint)red_x);
  png_save_uint_16(apStack_36,(uint)red_y);
  png_save_uint_16(apStack_34,(uint)green_x);
  png_save_uint_16(apStack_32,(uint)green_y);
  png_save_uint_16(buf,(uint)(ushort)buf._22_2_);
  png_save_uint_16(buf + 2,(uint)blue_y);
  png_save_uint_16(buf + 4,(uint)white_x);
  png_save_uint_16(buf + 6,(uint)white_y);
  png_save_uint_32(buf + 8,maxDL);
  png_save_uint_32(buf + 0xc,minDL);
  png_write_complete_chunk(png_ptr,0x6d444356,local_38,0x18);
  return;
}

Assistant:

void /* PRIVATE */
png_write_mDCV_fixed(png_structrp png_ptr,
   png_uint_16 red_x, png_uint_16 red_y,
   png_uint_16 green_x, png_uint_16 green_y,
   png_uint_16 blue_x, png_uint_16 blue_y,
   png_uint_16 white_x, png_uint_16 white_y,
   png_uint_32 maxDL, png_uint_32 minDL)
{
   png_byte buf[24];

   png_debug(1, "in png_write_mDCV_fixed");

   png_save_uint_16(buf +  0, red_x);
   png_save_uint_16(buf +  2, red_y);
   png_save_uint_16(buf +  4, green_x);
   png_save_uint_16(buf +  6, green_y);
   png_save_uint_16(buf +  8, blue_x);
   png_save_uint_16(buf + 10, blue_y);
   png_save_uint_16(buf + 12, white_x);
   png_save_uint_16(buf + 14, white_y);
   png_save_uint_32(buf + 16, maxDL);
   png_save_uint_32(buf + 20, minDL);

   png_write_complete_chunk(png_ptr, png_mDCV, buf, 24);
}